

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

void __thiscall
AppParametersTest_path_only_w_Test::TestBody(AppParametersTest_path_only_w_Test *this)

{
  unique_ptr<const_wchar_t_*[],_std::default_delete<const_wchar_t_*[]>_> uVar1;
  byte bVar2;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *lhs;
  long *plVar3;
  long lVar4;
  object *lhs_00;
  char *pcVar5;
  pointer *__ptr;
  bool bVar6;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_;
  object obj;
  ArgWrapper<wchar_t> args;
  app_parameters parameters;
  long *local_210;
  AssertHelper local_208;
  undefined7 uStack_207;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  undefined1 local_1f8 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1f0;
  long local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined8 local_1c8 [7];
  AssertHelper local_190 [8];
  ArgWrapper<wchar_t> local_188;
  app_parameters local_168 [336];
  
  ArgWrapper<wchar_t>::ArgWrapper<wchar_t_const*>(&local_188,L"/path/to/exe");
  uVar1._M_t.super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
  super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl =
       local_188.m_argv._M_t.
       super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
       super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
       super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl;
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_168,
             (int)((ulong)((long)local_188.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.m_args.
                                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (wchar_t **)
             uVar1._M_t.
             super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
             super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl,(wchar_t **)0x0,
             (unordered_set *)local_1d8);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_1d8);
  lhs = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
        jessilib::app_parameters::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[13]>
            ((internal *)local_1d8,"parameters.name()","u8\"/path/to/exe\"",lhs,
             (char8_t (*) [13])"/path/to/exe");
  if ((bool)local_1d8[0] == false) {
    testing::Message::Message((Message *)local_1f8);
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1d8._8_8_ ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_1d8._8_8_ !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1d8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._8_8_);
  }
  plVar3 = (long *)jessilib::app_parameters::arguments_abi_cxx11_();
  local_1f8[0] = (Message)(*plVar3 == plVar3[1]);
  local_1f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (*plVar3 != plVar3[1]) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_1d8,local_1f8,"parameters.arguments().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x60,(char *)CONCAT71(local_1d8._1_7_,local_1d8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if ((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
      operator_delete((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8[0] + 1);
    }
    if ((long *)CONCAT71(uStack_207,local_208) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_207,local_208) + 8))();
    }
  }
  if (local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0._M_head_impl);
  }
  plVar3 = (long *)jessilib::app_parameters::switches();
  local_1f8[0] = (Message)(*plVar3 == plVar3[1]);
  local_1f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (*plVar3 != plVar3[1]) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_1d8,local_1f8,"parameters.switches().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x61,(char *)CONCAT71(local_1d8._1_7_,local_1d8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if ((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
      operator_delete((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8[0] + 1);
    }
    if ((long *)CONCAT71(uStack_207,local_208) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_207,local_208) + 8))();
    }
  }
  if (local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0._M_head_impl);
  }
  lVar4 = jessilib::app_parameters::switches_set();
  bVar6 = *(long *)(lVar4 + 0x18) == 0;
  local_1f8[0] = (Message)bVar6;
  local_1f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar6) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_1d8,local_1f8,"parameters.switches_set().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x62,(char *)CONCAT71(local_1d8._1_7_,local_1d8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if ((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
      operator_delete((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8[0] + 1);
    }
    if ((long *)CONCAT71(uStack_207,local_208) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_207,local_208) + 8))();
    }
  }
  if (local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0._M_head_impl);
  }
  jessilib::app_parameters::values();
  local_1f8[0] = (Message)(local_1c8[1] == 0);
  local_1f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1d8);
  if (local_1f8[0] == (Message)0x0) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_1d8,local_1f8,"parameters.values().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,99,(char *)CONCAT71(local_1d8._1_7_,local_1d8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if ((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
      operator_delete((undefined8 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8[0] + 1);
    }
    if ((long *)CONCAT71(uStack_207,local_208) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_207,local_208) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0._M_head_impl);
  }
  jessilib::app_parameters::as_object();
  bVar2 = jessilib::object::null();
  local_208 = (AssertHelper)(bVar2 ^ 1);
  local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_1f8,(char *)&local_208,"obj.null()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x66,(char *)local_1f8);
    testing::internal::AssertHelper::operator=(local_190,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(local_190);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8[0] + 1);
    }
    if (local_210 != (long *)0x0) {
      (**(code **)(*local_210 + 8))();
    }
  }
  if (local_200 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_200,local_200);
  }
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_1f8,"Name","");
  lhs_00 = (object *)jessilib::object::operator[]((u8string *)local_1d8);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[13]>
            ((internal *)&local_208,"obj[u8\"Name\"]","u8\"/path/to/exe\"",lhs_00,
             (char8_t (*) [13])"/path/to/exe");
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8[0] + 1);
  }
  if (local_208 == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_200 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_200->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if (local_200 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_200,local_200);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_1d8);
  jessilib::app_parameters::~app_parameters(local_168);
  if (local_188.m_argv._M_t.
      super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
      super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)0x0) {
    operator_delete__((void *)local_188.m_argv._M_t.
                              super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>
                              .super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl);
  }
  local_188.m_argv._M_t.
  super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
  super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>,_true,_true>)
       (__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_188.m_args);
  return;
}

Assistant:

TEST(AppParametersTest, path_only_w) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_EQ(parameters.name(), u8"/path/to/exe");
	EXPECT_TRUE(parameters.arguments().empty());
	EXPECT_TRUE(parameters.switches().empty());
	EXPECT_TRUE(parameters.switches_set().empty());
	EXPECT_TRUE(parameters.values().empty());

	auto obj = parameters.as_object();
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
}